

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_tattle(REF_GEOM ref_geom,REF_INT node)

{
  int iVar1;
  uint local_2c;
  uint local_24;
  int local_20;
  uint local_1c;
  int local_18;
  REF_INT geom;
  REF_INT item;
  REF_INT node_local;
  REF_GEOM ref_geom_local;
  
  printf(" tattle on node = %d\n",(ulong)(uint)node);
  if ((node < 0) || (ref_geom->ref_adj->nnode <= node)) {
    local_20 = -1;
  }
  else {
    local_20 = ref_geom->ref_adj->first[node];
  }
  local_18 = local_20;
  if (local_20 == -1) {
    local_24 = 0xffffffff;
  }
  else {
    local_24 = ref_geom->ref_adj->item[local_20].ref;
  }
  local_1c = local_24;
  while (local_18 != -1) {
    iVar1 = ref_geom->descr[(int)(local_1c * 6)];
    if (iVar1 == 0) {
      printf("%d node: %d id, %d jump, %d degen, %d global\n",(ulong)local_1c,
             (ulong)(uint)ref_geom->descr[(int)(local_1c * 6 + 1)],
             (ulong)(uint)ref_geom->descr[(int)(local_1c * 6 + 3)],
             (ulong)(uint)ref_geom->descr[(int)(local_1c * 6 + 4)],
             (ulong)(uint)ref_geom->descr[(int)(local_1c * 6 + 5)]);
    }
    else if (iVar1 == 1) {
      printf("%d edge: %d id, %d jump, %d degen, %d global, t=%e\n",
             ref_geom->param[(int)(local_1c << 1)],(ulong)local_1c,
             (ulong)(uint)ref_geom->descr[(int)(local_1c * 6 + 1)],
             (ulong)(uint)ref_geom->descr[(int)(local_1c * 6 + 3)],
             (ulong)(uint)ref_geom->descr[(int)(local_1c * 6 + 4)],
             (ulong)(uint)ref_geom->descr[(int)(local_1c * 6 + 5)]);
    }
    else if (iVar1 == 2) {
      printf("%d face: %d id, %d jump, %d degen, %d global, uv= %e %e\n",
             ref_geom->param[(int)(local_1c << 1)],ref_geom->param[(int)(local_1c * 2 + 1)],
             (ulong)local_1c,(ulong)(uint)ref_geom->descr[(int)(local_1c * 6 + 1)],
             (ulong)(uint)ref_geom->descr[(int)(local_1c * 6 + 3)],
             (ulong)(uint)ref_geom->descr[(int)(local_1c * 6 + 4)],
             (ulong)(uint)ref_geom->descr[(int)(local_1c * 6 + 5)]);
    }
    local_18 = ref_geom->ref_adj->item[local_18].next;
    if (local_18 == -1) {
      local_2c = 0xffffffff;
    }
    else {
      local_2c = ref_geom->ref_adj->item[local_18].ref;
    }
    local_1c = local_2c;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tattle(REF_GEOM ref_geom, REF_INT node) {
  REF_INT item, geom;

  printf(" tattle on node = %d\n", node);
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    switch (ref_geom_type(ref_geom, geom)) {
      case REF_GEOM_NODE:
        printf("%d node: %d id, %d jump, %d degen, %d global\n", geom,
               ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom));
        break;
      case REF_GEOM_EDGE:
        printf("%d edge: %d id, %d jump, %d degen, %d global, t=%e\n", geom,
               ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom),
               ref_geom_param(ref_geom, 0, geom));
        break;
      case REF_GEOM_FACE:
        printf("%d face: %d id, %d jump, %d degen, %d global, uv= %e %e\n",
               geom, ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom),
               ref_geom_param(ref_geom, 0, geom),
               ref_geom_param(ref_geom, 1, geom));
        break;
    }
  }

  return REF_SUCCESS;
}